

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_bitwise.cpp
# Opt level: O2

spv_result_t
spvtools::val::ValidateBaseType(ValidationState_t *_,Instruction *inst,uint32_t base_type)

{
  bool bVar1;
  uint32_t uVar2;
  Op opcode;
  char *pcVar3;
  string sStack_228;
  DiagnosticStream local_208;
  
  opcode = (Op)(inst->inst_).opcode;
  bVar1 = ValidationState_t::IsIntScalarType(_,base_type);
  if ((bVar1) || (bVar1 = ValidationState_t::IsIntVectorType(_,base_type), bVar1)) {
    bVar1 = spvIsVulkanEnv(_->context_->target_env);
    if ((bVar1) &&
       ((uVar2 = ValidationState_t::GetBitWidth(_,base_type), uVar2 != 0x20 &&
        (_->options_->allow_vulkan_32_bit_bitwise == false)))) {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      ValidationState_t::VkErrorID_abi_cxx11_(&sStack_228,_,0x12ad,(char *)0x0);
      std::operator<<((ostream *)&local_208,(string *)&sStack_228);
      std::operator<<((ostream *)&local_208,"Expected 32-bit int type for Base operand: ");
      pcVar3 = spvOpcodeString(opcode);
      std::operator<<((ostream *)&local_208,pcVar3);
      std::__cxx11::string::_M_dispose();
      goto LAB_005216c4;
    }
    if (opcode == OpBitCount) {
      return SPV_SUCCESS;
    }
    if ((inst->inst_).type_id == base_type) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Expected Base Type to be equal to Result Type: ";
  }
  else {
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar3 = "Expected int scalar or vector type for Base operand: ";
  }
  std::operator<<((ostream *)&local_208,pcVar3);
  pcVar3 = spvOpcodeString(opcode);
  std::operator<<((ostream *)&local_208,pcVar3);
LAB_005216c4:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateBaseType(ValidationState_t& _, const Instruction* inst,
                              const uint32_t base_type) {
  const spv::Op opcode = inst->opcode();

  if (!_.IsIntScalarType(base_type) && !_.IsIntVectorType(base_type)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected int scalar or vector type for Base operand: "
           << spvOpcodeString(opcode);
  }

  // Vulkan has a restriction to 32 bit for base
  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (_.GetBitWidth(base_type) != 32 &&
        !_.options()->allow_vulkan_32_bit_bitwise) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4781)
             << "Expected 32-bit int type for Base operand: "
             << spvOpcodeString(opcode);
    }
  }

  // OpBitCount just needs same number of components
  if (base_type != inst->type_id() && opcode != spv::Op::OpBitCount) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Base Type to be equal to Result Type: "
           << spvOpcodeString(opcode);
  }

  return SPV_SUCCESS;
}